

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<VcsolutionDepend_*>::begin(QList<VcsolutionDepend_*> *this)

{
  VcsolutionDepend **n;
  QArrayDataPointer<VcsolutionDepend_*> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<VcsolutionDepend_*> *)0x28d659);
  QArrayDataPointer<VcsolutionDepend_*>::operator->(in_RDI);
  n = QArrayDataPointer<VcsolutionDepend_*>::begin
                ((QArrayDataPointer<VcsolutionDepend_*> *)0x28d66a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }